

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,VariableDatum *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Variable Datum:",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tID:          ",0xf);
  ENUMS::GetEnumAsStringDatumID_abi_cxx11_(&local_1c0,(ENUMS *)(ulong)this->m_ui32DatumID,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLength:      ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tValue(S):    ",0xf);
  (*(this->super_DataTypeBase)._vptr_DataTypeBase[0xb])(&local_1e0,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString VariableDatum::GetAsString() const
{
    KStringStream ss;

    // For now we return the datum value as a string.
    ss << "Variable Datum:"
       << "\n\tID:          " << GetEnumAsStringDatumID( m_ui32DatumID )
       << "\n\tLength:      " << m_ui32DatumLength
       << "\n\tValue(S):    " << GetDatumValueAsKString()
       << "\n";

    return ss.str();
}